

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Rotate
                  (Image *__return_storage_ptr__,RotateForm4 rotate,Image *in,uint32_t x,uint32_t y,
                  double centerX,double centerY,uint32_t width,uint32_t height,double angle)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,width,height,in->_colorCount,'\x01');
  (*rotate)(in,x,y,centerX,centerY,__return_storage_ptr__,0,0,centerX,centerY,width,height,angle);
  return __return_storage_ptr__;
}

Assistant:

Image Rotate( FunctionTable::RotateForm4 rotate,
                  const Image & in, uint32_t x, uint32_t y, double centerX, double centerY, uint32_t width, uint32_t height, double angle )
    {
        Image_Function::ParameterValidation( in, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( in );

        Image out = in.generate( width, height, in.colorCount() );

        rotate( in, x, y, centerX, centerY, out, 0, 0, centerX, centerY, width, height, angle );

        return out;
    }